

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O1

void BuildAndStoreCommandPrefixCode
               (uint32_t *histogram,uint8_t *depth,uint16_t *bits,size_t *storage_ix,
               uint8_t *storage)

{
  uint8_t *depth_00;
  size_t *storage_ix_00;
  uint8_t *storage_00;
  long lVar1;
  uint16_t cmd_bits [64];
  uint8_t cmd_depth [704];
  HuffmanTree tree [129];
  uint8_t auStack_838 [128];
  uint8_t auStack_7b8 [40];
  undefined8 uStack_790;
  size_t *local_788;
  uint8_t *local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 local_678 [8];
  undefined8 local_638;
  uint8_t auStack_5f8 [128];
  undefined8 local_578;
  uint8_t auStack_538 [256];
  HuffmanTree local_438 [129];
  
  uStack_790 = 0x134a33;
  local_788 = storage_ix;
  local_780 = storage;
  memset(&local_6f8,0,0x2c0);
  uStack_790 = 0x134a53;
  BrotliCreateHuffmanTree(histogram,0x40,0xf,local_438,depth);
  depth_00 = depth + 0x40;
  uStack_790 = 0x134a76;
  BrotliCreateHuffmanTree(histogram + 0x40,0x40,0xe,local_438,depth_00);
  local_6e8 = *(undefined8 *)(depth + 0x10);
  local_6f8 = *(undefined8 *)depth;
  uStack_6f0 = *(undefined8 *)(depth + 8);
  uStack_6e0 = *(undefined8 *)(depth + 0x28);
  local_6d8 = *(undefined8 *)(depth + 0x18);
  uStack_6d0 = *(undefined8 *)(depth + 0x30);
  local_6c8 = *(undefined8 *)(depth + 0x20);
  uStack_6c0 = *(undefined8 *)(depth + 0x38);
  uStack_790 = 0x134ac4;
  BrotliConvertBitDepthsToSymbols((uint8_t *)&local_6f8,0x40,(uint16_t *)&local_778);
  *(undefined8 *)(bits + 0x10) = local_758;
  *(undefined8 *)(bits + 0x14) = uStack_750;
  *(undefined8 *)(bits + 8) = local_768;
  *(undefined8 *)(bits + 0xc) = uStack_760;
  *(undefined8 *)bits = local_778;
  *(undefined8 *)(bits + 4) = uStack_770;
  *(undefined8 *)(bits + 0x18) = local_738;
  *(undefined8 *)(bits + 0x1c) = uStack_730;
  *(undefined8 *)(bits + 0x20) = local_718;
  *(undefined8 *)(bits + 0x24) = uStack_710;
  *(undefined8 *)(bits + 0x28) = local_748;
  *(undefined8 *)(bits + 0x2c) = uStack_740;
  *(undefined8 *)(bits + 0x30) = local_728;
  *(undefined8 *)(bits + 0x34) = uStack_720;
  *(undefined8 *)(bits + 0x38) = local_708;
  *(undefined8 *)(bits + 0x3c) = uStack_700;
  uStack_790 = 0x134b17;
  BrotliConvertBitDepthsToSymbols(depth_00,0x40,bits + 0x40);
  storage_00 = local_780;
  storage_ix_00 = local_788;
  local_6c8 = 0;
  uStack_6c0 = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  local_6e8 = 0;
  uStack_6e0 = 0;
  uStack_6f0 = 0;
  local_6f8 = *(undefined8 *)depth;
  local_6b8 = *(undefined8 *)(depth + 8);
  local_678[0] = *(undefined8 *)(depth + 0x10);
  local_638 = *(undefined8 *)(depth + 0x18);
  local_578 = *(undefined8 *)(depth + 0x20);
  lVar1 = 0x38;
  do {
    auStack_838[lVar1 * 8] = depth[lVar1 + -0x10];
    auStack_7b8[lVar1 * 8] = depth[lVar1 + -8];
    *(uint8_t *)(&local_6f8 + lVar1) = depth[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  uStack_790 = 0x134bb8;
  BrotliStoreHuffmanTree((uint8_t *)&local_6f8,0x2c0,local_438,local_788,local_780);
  uStack_790 = 0x134bce;
  BrotliStoreHuffmanTree(depth_00,0x40,local_438,storage_ix_00,storage_00);
  return;
}

Assistant:

static void BuildAndStoreCommandPrefixCode(const uint32_t histogram[128],
    uint8_t depth[128], uint16_t bits[128], size_t* storage_ix,
    uint8_t* storage) {
  /* Tree size for building a tree over 64 symbols is 2 * 64 + 1. */
  HuffmanTree tree[129];
  uint8_t cmd_depth[BROTLI_NUM_COMMAND_SYMBOLS] = { 0 };
  uint16_t cmd_bits[64];

  BrotliCreateHuffmanTree(histogram, 64, 15, tree, depth);
  BrotliCreateHuffmanTree(&histogram[64], 64, 14, tree, &depth[64]);
  /* We have to jump through a few hoops here in order to compute
     the command bits because the symbols are in a different order than in
     the full alphabet. This looks complicated, but having the symbols
     in this order in the command bits saves a few branches in the Emit*
     functions. */
  memcpy(cmd_depth, depth, 24);
  memcpy(cmd_depth + 24, depth + 40, 8);
  memcpy(cmd_depth + 32, depth + 24, 8);
  memcpy(cmd_depth + 40, depth + 48, 8);
  memcpy(cmd_depth + 48, depth + 32, 8);
  memcpy(cmd_depth + 56, depth + 56, 8);
  BrotliConvertBitDepthsToSymbols(cmd_depth, 64, cmd_bits);
  memcpy(bits, cmd_bits, 48);
  memcpy(bits + 24, cmd_bits + 32, 16);
  memcpy(bits + 32, cmd_bits + 48, 16);
  memcpy(bits + 40, cmd_bits + 24, 16);
  memcpy(bits + 48, cmd_bits + 40, 16);
  memcpy(bits + 56, cmd_bits + 56, 16);
  BrotliConvertBitDepthsToSymbols(&depth[64], 64, &bits[64]);
  {
    /* Create the bit length array for the full command alphabet. */
    size_t i;
    memset(cmd_depth, 0, 64);  /* only 64 first values were used */
    memcpy(cmd_depth, depth, 8);
    memcpy(cmd_depth + 64, depth + 8, 8);
    memcpy(cmd_depth + 128, depth + 16, 8);
    memcpy(cmd_depth + 192, depth + 24, 8);
    memcpy(cmd_depth + 384, depth + 32, 8);
    for (i = 0; i < 8; ++i) {
      cmd_depth[128 + 8 * i] = depth[40 + i];
      cmd_depth[256 + 8 * i] = depth[48 + i];
      cmd_depth[448 + 8 * i] = depth[56 + i];
    }
    BrotliStoreHuffmanTree(
        cmd_depth, BROTLI_NUM_COMMAND_SYMBOLS, tree, storage_ix, storage);
  }
  BrotliStoreHuffmanTree(&depth[64], 64, tree, storage_ix, storage);
}